

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O2

NFRule * __thiscall icu_63::NFRuleSet::findFractionRuleSetRule(NFRuleSet *this,double number)

{
  uint uVar1;
  NFRule **ppNVar2;
  uint uVar3;
  long lVar4;
  int64_t iVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint32_t i;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  
  ppNVar2 = (this->rules).fStuff;
  uVar11 = (*ppNVar2)->baseValue;
  for (uVar12 = 1; uVar12 < (this->rules).fCount; uVar12 = uVar12 + 1) {
    lVar6 = ppNVar2[uVar12]->baseValue;
    bVar7 = 0;
    lVar4 = lVar6;
    for (uVar13 = uVar11; (((uint)uVar13 | (uint)lVar4) & 1) == 0; uVar13 = (long)uVar13 >> 1) {
      lVar4 = lVar4 >> 1;
      bVar7 = bVar7 + 1;
    }
    uVar9 = -lVar4;
    if ((uVar13 & 1) == 0) {
      uVar9 = uVar13;
    }
    while (uVar9 != 0) {
      do {
        uVar8 = uVar9;
        uVar9 = (long)uVar8 >> 1;
      } while ((uVar8 & 1) == 0);
      lVar10 = -uVar8;
      if (0 < (long)uVar8) {
        uVar13 = uVar8;
        lVar10 = lVar4;
      }
      lVar4 = lVar10;
      uVar9 = uVar13 - lVar4;
    }
    uVar11 = ((long)uVar11 / (long)(uVar13 << (bVar7 & 0x3f))) * lVar6;
  }
  iVar5 = util64_fromDouble((double)(long)uVar11 * number + 0.5);
  dVar14 = uprv_maxMantissa_63();
  lVar6 = util64_fromDouble(dVar14);
  uVar1 = (this->rules).fCount;
  ppNVar2 = (this->rules).fStuff;
  uVar13 = 0;
  uVar12 = 0;
  do {
    if (uVar1 == uVar13) {
LAB_0025ba6e:
      uVar3 = (int)uVar12 + 1;
      if (uVar3 < uVar1) {
        if (ppNVar2[uVar3]->baseValue == ppNVar2[uVar12]->baseValue) {
          dVar14 = (double)ppNVar2[uVar3]->baseValue * number;
          if (2.0 <= dVar14) {
            uVar12 = (ulong)uVar3;
          }
          if (dVar14 < 0.5) {
            uVar12 = (ulong)uVar3;
          }
        }
      }
      else if (ppNVar2 == (NFRule **)0x0) {
        return (NFRule *)0x0;
      }
      return ppNVar2[uVar12];
    }
    lVar10 = (ppNVar2[uVar13]->baseValue * iVar5) % (long)uVar11;
    lVar4 = uVar11 - lVar10;
    if (lVar10 <= (long)(uVar11 - lVar10)) {
      lVar4 = lVar10;
    }
    if (lVar4 < lVar6) {
      if (lVar4 == 0) {
        uVar12 = uVar13 & 0xffffffff;
        goto LAB_0025ba6e;
      }
      uVar12 = uVar13 & 0xffffffff;
      lVar6 = lVar4;
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

const NFRule*
NFRuleSet::findFractionRuleSetRule(double number) const
{
    // the obvious way to do this (multiply the value being formatted
    // by each rule's base value until you get an integral result)
    // doesn't work because of rounding error.  This method is more
    // accurate

    // find the least common multiple of the rules' base values
    // and multiply this by the number being formatted.  This is
    // all the precision we need, and we can do all of the rest
    // of the math using integer arithmetic
    int64_t leastCommonMultiple = rules[0]->getBaseValue();
    int64_t numerator;
    {
        for (uint32_t i = 1; i < rules.size(); ++i) {
            leastCommonMultiple = util_lcm(leastCommonMultiple, rules[i]->getBaseValue());
        }
        numerator = util64_fromDouble(number * (double)leastCommonMultiple + 0.5);
    }
    // for each rule, do the following...
    int64_t tempDifference;
    int64_t difference = util64_fromDouble(uprv_maxMantissa());
    int32_t winner = 0;
    for (uint32_t i = 0; i < rules.size(); ++i) {
        // "numerator" is the numerator of the fraction if the
        // denominator is the LCD.  The numerator if the rule's
        // base value is the denominator is "numerator" times the
        // base value divided bythe LCD.  Here we check to see if
        // that's an integer, and if not, how close it is to being
        // an integer.
        tempDifference = numerator * rules[i]->getBaseValue() % leastCommonMultiple;


        // normalize the result of the above calculation: we want
        // the numerator's distance from the CLOSEST multiple
        // of the LCD
        if (leastCommonMultiple - tempDifference < tempDifference) {
            tempDifference = leastCommonMultiple - tempDifference;
        }

        // if this is as close as we've come, keep track of how close
        // that is, and the line number of the rule that did it.  If
        // we've scored a direct hit, we don't have to look at any more
        // rules
        if (tempDifference < difference) {
            difference = tempDifference;
            winner = i;
            if (difference == 0) {
                break;
            }
        }
    }

    // if we have two successive rules that both have the winning base
    // value, then the first one (the one we found above) is used if
    // the numerator of the fraction is 1 and the second one is used if
    // the numerator of the fraction is anything else (this lets us
    // do things like "one third"/"two thirds" without haveing to define
    // a whole bunch of extra rule sets)
    if ((unsigned)(winner + 1) < rules.size() &&
        rules[winner + 1]->getBaseValue() == rules[winner]->getBaseValue()) {
        double n = ((double)rules[winner]->getBaseValue()) * number;
        if (n < 0.5 || n >= 2) {
            ++winner;
        }
    }

    // finally, return the winning rule
    return rules[winner];
}